

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

bool CharArrayParms(int *capacity,int *offset,int *a,int *Stack,int *sp,bool ranged)

{
  bool bVar1;
  int iVar2;
  undefined3 in_register_00000089;
  
  if (CONCAT31(in_register_00000089,ranged) == 0) {
    *capacity = 0x7fffffff;
    *offset = 0;
    iVar2 = *sp;
  }
  else {
    *capacity = Stack[(long)*sp + -1];
    iVar2 = Stack[(long)*sp + -2];
    *offset = iVar2;
    if ((*capacity < 1) || (iVar2 < 0)) {
      iVar2 = *sp + -4;
      bVar1 = false;
      goto LAB_005130be;
    }
    iVar2 = *sp + -2;
    *sp = iVar2;
  }
  *a = Stack[(long)iVar2 + -1];
  *offset = *offset + Stack[(long)*sp + -2];
  iVar2 = *sp + -2;
  bVar1 = true;
LAB_005130be:
  *sp = iVar2;
  return bVar1;
}

Assistant:

static bool CharArrayParms(int &capacity, int &offset, int &a, int *Stack, int &sp, bool ranged)
{
	if (ranged)
	{
		capacity = STACK(1);
		offset = STACK(2);
		if (capacity < 1 || offset < 0)
		{
			sp -= 4;
			return false;
		}
		sp -= 2;
	}
	else
	{
		capacity = INT_MAX;
		offset = 0;
	}
	a = STACK(1);
	offset += STACK(2);
	sp -= 2;
	return true;
}